

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgOptimizationUtils.hpp
# Opt level: O0

void TasOptimization::checkVarSize(string *method_name,string *var_name,int var_size,int exp_size)

{
  runtime_error *this;
  string local_170;
  string local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  int local_20;
  int local_1c;
  int exp_size_local;
  int var_size_local;
  string *var_name_local;
  string *method_name_local;
  
  if (var_size != exp_size) {
    local_20 = exp_size;
    local_1c = var_size;
    _exp_size_local = var_name;
    var_name_local = method_name;
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(&local_120,"Size of ",var_name);
    std::operator+(&local_100,&local_120," (");
    std::__cxx11::to_string(&local_150,local_1c);
    std::operator+(&local_e0,&local_100,&local_150);
    std::operator+(&local_c0,&local_e0,") in the function ");
    std::operator+(&local_a0,&local_c0,method_name);
    std::operator+(&local_80,&local_a0,"() is not equal to its expected value of (");
    std::__cxx11::to_string(&local_170,local_20);
    std::operator+(&local_60,&local_80,&local_170);
    std::operator+(&local_40,&local_60,")");
    std::runtime_error::runtime_error(this,(string *)&local_40);
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return;
}

Assistant:

inline void checkVarSize(const std::string method_name, const std::string var_name, const int var_size, const int exp_size) {
    if (var_size != exp_size) {
        throw std::runtime_error("Size of " + var_name + " (" + std::to_string(var_size) + ") in the function " + method_name +
                                 "() is not equal to its expected value of (" + std::to_string(exp_size) + ")");
    }
}